

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall MakefileGenerator::pkgConfigFileName(MakefileGenerator *this,bool fixify)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  ulong uVar5;
  byte in_DL;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int dot;
  int slsh;
  QString *ret;
  QString subdir;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000025c;
  undefined4 in_stack_fffffffffffffcf8;
  CaseSensitivity in_stack_fffffffffffffcfc;
  ProKey *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  ProKey *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  byte bVar6;
  byte bVar7;
  undefined1 in_stack_fffffffffffffd2e;
  QChar ch;
  QString *ch_00;
  undefined1 in_stack_fffffffffffffda7;
  QString *in_stack_fffffffffffffda8;
  MakefileGenerator *in_stack_fffffffffffffdb0;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  QChar local_12a;
  undefined1 local_128 [24];
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  ch_00 = in_RDI;
  ProKey::ProKey(in_stack_fffffffffffffd00,
                 (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
             in_stack_fffffffffffffd10);
  ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  ProString::~ProString((ProString *)0x1a2f83);
  ProKey::~ProKey((ProKey *)0x1a2f90);
  bVar1 = QString::isEmpty((QString *)0x1a2f9a);
  if (bVar1) {
    ProKey::ProKey(in_stack_fffffffffffffd00,
                   (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QMakeEvaluator::first
              ((QMakeEvaluator *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               in_stack_fffffffffffffd10);
    ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
    ;
    QString::operator=((QString *)in_stack_fffffffffffffd00,
                       (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QString::~QString((QString *)0x1a3016);
    ProString::~ProString((ProString *)0x1a3023);
    ProKey::~ProKey((ProKey *)0x1a3030);
    qVar4 = QString::lastIndexOf
                      ((QString *)in_stack_fffffffffffffd10,
                       (QString *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                       (CaseSensitivity)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    if ((int)qVar4 != -1) {
      QString::size(in_RDI);
      QString::right((QString *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                     (qsizetype)in_stack_fffffffffffffd10);
      QString::operator=((QString *)in_stack_fffffffffffffd00,
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x1a309b);
    }
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (char *)ch_00);
    uVar2 = QString::startsWith((QString *)in_RDI,(CaseSensitivity)local_110);
    ch.ucs = CONCAT11(uVar2,in_stack_fffffffffffffd2e);
    QString::~QString((QString *)0x1a30d7);
    if ((ch.ucs & 0x100U) != 0) {
      QString::mid((longlong)local_128,(longlong)in_RDI);
      QString::operator=((QString *)in_stack_fffffffffffffd00,
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x1a311e);
    }
    QChar::QChar<char,_true>(&local_12a,'.');
    qVar4 = QString::indexOf((QString *)
                             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),ch,
                             (qsizetype)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    if ((int)qVar4 != -1) {
      QString::left((QString *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                    (qsizetype)in_stack_fffffffffffffd10);
      QString::operator=((QString *)in_stack_fffffffffffffd00,
                         (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x1a318c);
    }
  }
  QString::operator+=((QString *)in_stack_fffffffffffffd00,
                      (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_160 = 0xaaaaaaaaaaaaaaaa;
  local_158 = 0xaaaaaaaaaaaaaaaa;
  local_150 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey(in_stack_fffffffffffffd00,
                 (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  QMakeEvaluator::first
            ((QMakeEvaluator *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
             in_stack_fffffffffffffd10);
  ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  ProString::~ProString((ProString *)0x1a322d);
  ProKey::~ProKey((ProKey *)0x1a323a);
  bVar1 = QString::isEmpty((QString *)0x1a3247);
  if (!bVar1) {
    uVar5 = QString::endsWith((QString *)&local_160,0x3bdbd8);
    if ((uVar5 & 1) == 0) {
      QString::prepend((QString *)in_stack_fffffffffffffd00,
                       (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    }
    QString::prepend((QString *)in_stack_fffffffffffffd00,
                     (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  }
  if ((in_DL & 1) != 0) {
    uVar3 = QDir::isRelativePath((QString *)in_RDI);
    bVar6 = 0;
    bVar7 = bVar6;
    if ((uVar3 & 1) != 0) {
      in_stack_fffffffffffffd10 = *(ProKey **)(in_RSI + 0xd8);
      ProKey::ProKey(in_stack_fffffffffffffd00,
                     (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      bVar1 = QMakeProject::isEmpty
                        ((QMakeProject *)CONCAT17(bVar6,in_stack_fffffffffffffd18),
                         in_stack_fffffffffffffd10);
      bVar6 = bVar1 ^ 0xff;
      bVar7 = bVar6;
      ProKey::~ProKey((ProKey *)0x1a3314);
    }
    if ((bVar6 & 1) != 0) {
      in_stack_fffffffffffffd00 = *(ProKey **)(in_RSI + 0xd8);
      ProKey::ProKey(in_stack_fffffffffffffd00,
                     (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QMakeEvaluator::first
                ((QMakeEvaluator *)CONCAT17(bVar7,in_stack_fffffffffffffd18),
                 in_stack_fffffffffffffd10);
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::prepend((QString *)in_stack_fffffffffffffd00,
                       (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QString::~QString((QString *)0x1a3394);
      ProString::~ProString((ProString *)0x1a33a1);
      ProKey::~ProKey((ProKey *)0x1a33ae);
    }
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcfc);
    fileFixify(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (FileFixifyTypes)in_stack_0000025c.i,(bool)in_stack_fffffffffffffda7);
    QString::operator=((QString *)in_stack_fffffffffffffd00,
                       (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QString::~QString((QString *)0x1a3403);
  }
  QString::~QString((QString *)0x1a3415);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ch_00;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::pkgConfigFileName(bool fixify)
{
    QString ret = project->first("QMAKE_PKGCONFIG_FILE").toQString();
    if (ret.isEmpty()) {
        ret = project->first("TARGET").toQString();
        int slsh = ret.lastIndexOf(Option::dir_sep);
        if (slsh != -1)
            ret = ret.right(ret.size() - slsh - 1);
        if (ret.startsWith("lib"))
            ret = ret.mid(3);
        int dot = ret.indexOf('.');
        if (dot != -1)
            ret = ret.left(dot);
    }
    ret += Option::pkgcfg_ext;
    QString subdir = project->first("QMAKE_PKGCONFIG_DESTDIR").toQString();
    if(!subdir.isEmpty()) {
        // initOutPaths() appends dir_sep, but just to be safe..
        if (!subdir.endsWith(Option::dir_sep))
            ret.prepend(Option::dir_sep);
        ret.prepend(subdir);
    }
    if(fixify) {
        if(QDir::isRelativePath(ret) && !project->isEmpty("DESTDIR"))
            ret.prepend(project->first("DESTDIR").toQString());
        ret = fileFixify(ret, FileFixifyBackwards);
    }
    return ret;
}